

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

void __thiscall
TestClass::handleSyncFunc6
          (TestClass *this,uint64_t *p1,uint32_t *p2,uint16_t *p3,uint8_t *p4,int64_t *p5,
          int32_t *p6)

{
  *p1 = *p1 + 0x400;
  *p2 = *p2 + 0x200;
  *p3 = *p3 + 0x100;
  *p4 = *p4 + '\x10';
  *p5 = *p5 + -0x400;
  *p6 = *p6 + -0x200;
  return;
}

Assistant:

void handleSyncFunc6(uint64_t &p1, uint32_t &p2, uint16_t &p3, uint8_t &p4,
				   int64_t &p5, int32_t &p6)
	{
		LOG_INFO("Received Sync6, %llu, %u, %u, %u, %lld, %d", p1, p2, p3, p4, p5, p6);
		p1+=1024;
		p2+=512;
		p3+=256;
		p4+=16;
		p5-=1024;
		p6-=512;
	}